

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaUtilityTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaUtilityTargetGenerator::WriteUtilBuildStatements
          (cmNinjaUtilityTargetGenerator *this,string *config,string *fileConfig)

{
  cmGeneratorTarget *this_00;
  cmLocalNinjaGenerator *this_01;
  undefined8 *puVar1;
  cmCustomCommand *pcVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile_00;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar5;
  bool bVar6;
  __type _Var7;
  TargetType TVar8;
  cmGlobalNinjaGenerator *this_02;
  string *psVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  cmCustomCommand *pcVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  MapToNinjaPathImpl MVar13;
  cmValue cVar14;
  size_type sVar15;
  cmGeneratedFileStream *pcVar16;
  pointer *ppcVar17;
  cmOutputConverter *this_03;
  long lVar18;
  string_view source;
  string_view source_00;
  undefined8 uVar19;
  allocator<char> local_5da;
  allocator<char> local_5d9;
  array<const_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_*,_2UL> cmdLists;
  string ccConfig;
  string local_598;
  cmNinjaDeps deps;
  bool local_540;
  string desc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  CCOutputs util_outputs;
  string utilCommandName;
  string local_498;
  _Any_data local_478;
  undefined8 local_468;
  undefined8 uStack_460;
  string configDir;
  cmNinjaDeps local_438;
  cmNinjaDeps local_418;
  _Any_data local_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  string local_3d8;
  string local_3b8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  string local_348;
  string local_328;
  string local_308;
  CCOutputs local_2e8;
  string outputConfig;
  cmNinjaBuild phonyBuild;
  
  this_02 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  this_01 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  configDir._M_dataplus._M_p = (pointer)&configDir.field_2;
  configDir._M_string_length = 0;
  configDir.field_2._M_local_buf[0] = '\0';
  bVar6 = cmTarget::IsPerConfig(this_00->Target);
  if (bVar6) {
    (*(this_02->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49]
    )(&outputConfig,this_02,fileConfig);
    std::__cxx11::string::operator=((string *)&configDir,(string *)&outputConfig);
    std::__cxx11::string::~string((string *)&outputConfig);
  }
  psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_01);
  outputConfig._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
  outputConfig._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
  phonyBuild.Comment._M_dataplus._M_p = &DAT_0000000b;
  phonyBuild.Comment._M_string_length = (size_type)anon_var_dwarf_32b0f4;
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)&util_outputs,&this->super_cmNinjaTargetGenerator);
  cmStrCat<std::__cxx11::string,char[2],std::__cxx11::string,char[6]>
            (&utilCommandName,(cmAlphaNum *)&outputConfig,(cmAlphaNum *)&phonyBuild,&configDir,
             (char (*) [2])0x618212,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&util_outputs,
             (char (*) [6])".util");
  std::__cxx11::string::~string((string *)&util_outputs);
  cmNinjaTargetGenerator::ConvertToNinjaPath(&this->super_cmNinjaTargetGenerator,&utilCommandName);
  std::__cxx11::string::_M_assign((string *)&utilCommandName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"phony",(allocator<char> *)&outputConfig);
  cmNinjaBuild::cmNinjaBuild(&phonyBuild,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  util_outputs.ExplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  util_outputs.ExplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  util_outputs.ExplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  util_outputs.WorkDirOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  util_outputs.WorkDirOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  util_outputs.WorkDirOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  util_outputs.GG = this_02;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &util_outputs.ExplicitOuts,&utilCommandName);
  cmdLists._M_elems[0] = cmGeneratorTarget::GetPreBuildCommands(this_00);
  cmdLists._M_elems[1] = cmGeneratorTarget::GetPostBuildCommands(this_00);
  local_540 = false;
  for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 8) {
    puVar1 = *(undefined8 **)((long)cmdLists._M_elems + lVar18);
    pcVar11 = (cmCustomCommand *)*puVar1;
    pcVar2 = (cmCustomCommand *)puVar1[1];
    while( true ) {
      if (pcVar11 == pcVar2) break;
      uVar19 = 0x30ea0c;
      std::__cxx11::string::string((string *)&local_328,(string *)fileConfig);
      local_398._M_engaged = false;
      local_478._M_unused._M_object = (void *)0x0;
      local_478._8_8_ = 0;
      local_468 = 0;
      uStack_460 = 0;
      computeInternalDepfile.super__Function_base._M_functor._8_8_ = uVar19;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_478;
      computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)this;
      computeInternalDepfile._M_invoker = (_Invoker_type)config;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&outputConfig,pcVar11,&local_328,
                 (cmLocalGenerator *)this_01,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,computeInternalDepfile);
      std::_Function_base::~_Function_base((_Function_base *)&local_478);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_398);
      std::__cxx11::string::~string((string *)&local_328);
      cmLocalNinjaGenerator::AppendCustomCommandDeps
                (this_01,(cmCustomCommandGenerator *)&outputConfig,&deps,fileConfig);
      cmLocalNinjaGenerator::AppendCustomCommandLines
                (this_01,(cmCustomCommandGenerator *)&outputConfig,&commands);
      pvVar10 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                          ((cmCustomCommandGenerator *)&outputConfig);
      cmGlobalNinjaGenerator::CCOutputs::Add(&util_outputs,pvVar10);
      bVar6 = cmCustomCommand::GetUsesTerminal(pcVar11);
      local_540 = (bool)(local_540 | bVar6);
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&outputConfig)
      ;
      pcVar11 = pcVar11 + 1;
    }
  }
  cmdLists._M_elems[0] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0;
  cmdLists._M_elems[1] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0;
  cmGeneratorTarget::GetSourceFiles
            (this_00,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&cmdLists,config);
  pvVar5 = cmdLists._M_elems[1];
  for (ppcVar17 = (pointer *)cmdLists._M_elems[0];
      (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)ppcVar17 != pvVar5;
      ppcVar17 = ppcVar17 + 1) {
    pcVar11 = cmSourceFile::GetCustomCommand((cmSourceFile *)*ppcVar17);
    if (pcVar11 != (cmCustomCommand *)0x0) {
      uVar19 = 0x30eb80;
      std::__cxx11::string::string((string *)&local_348,(string *)config);
      local_370._M_engaged = false;
      local_3f8._M_unused._M_object = (void *)0x0;
      local_3f8._8_8_ = 0;
      local_3e8 = 0;
      uStack_3e0 = 0;
      computeInternalDepfile_00.super__Function_base._M_functor._8_8_ = uVar19;
      computeInternalDepfile_00.super__Function_base._M_functor._M_unused._M_object = &local_3f8;
      computeInternalDepfile_00.super__Function_base._M_manager = (_Manager_type)this;
      computeInternalDepfile_00._M_invoker = (_Invoker_type)config;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&outputConfig,pcVar11,&local_348,
                 (cmLocalGenerator *)this_01,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_370,computeInternalDepfile_00);
      std::_Function_base::~_Function_base((_Function_base *)&local_3f8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_370);
      std::__cxx11::string::~string((string *)&local_348);
      cmLocalNinjaGenerator::AddCustomCommandTarget(this_01,pcVar11,this_00);
      pvVar10 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                          ((cmCustomCommandGenerator *)&outputConfig);
      pvVar12 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                          ((cmCustomCommandGenerator *)&outputConfig);
      _Var3._M_current =
           (pvVar10->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var4._M_current =
           (pvVar10->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar13.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var3,_Var4,&deps,MVar13);
      _Var3._M_current =
           (pvVar12->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var4._M_current =
           (pvVar12->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar13.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var3,_Var4,&deps,MVar13);
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&outputConfig)
      ;
    }
  }
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&cmdLists);
  outputConfig._M_dataplus._M_p = (pointer)&outputConfig.field_2;
  outputConfig._M_string_length = 0;
  outputConfig.field_2._M_local_buf[0] = '\0';
  bVar6 = cmTarget::IsPerConfig(this_00->Target);
  if (bVar6) {
    std::__cxx11::string::_M_assign((string *)&outputConfig);
  }
  cmLocalNinjaGenerator::AppendTargetOutputs(this_01,this_00,&phonyBuild.Outputs,&outputConfig);
  TVar8 = cmTarget::GetType(this_00->Target);
  if (TVar8 != GLOBAL_TARGET) {
    cmLocalNinjaGenerator::AppendTargetOutputs
              (this_01,this_00,&this_02->ByproductsForCleanTarget,config);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (util_outputs.ExplicitOuts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               util_outputs.ExplicitOuts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )&this_02->ByproductsForCleanTarget);
  }
  cmLocalNinjaGenerator::AppendTargetDepends
            (this_01,this_00,&deps,config,fileConfig,DependOnTargetArtifact);
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&desc,&this->super_cmNinjaTargetGenerator);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmdLists,
                   "Utility command for ",&desc);
    std::__cxx11::string::operator=((string *)&phonyBuild,(string *)&cmdLists);
    std::__cxx11::string::~string((string *)&cmdLists);
    std::__cxx11::string::~string((string *)&desc);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&phonyBuild.ExplicitDeps,&deps);
    TVar8 = cmGeneratorTarget::GetType(this_00);
    if (TVar8 == GLOBAL_TARGET) {
      pcVar16 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
    }
    else {
      pcVar16 = cmNinjaTargetGenerator::GetImplFileStream
                          (&this->super_cmNinjaTargetGenerator,fileConfig);
    }
    cmGlobalNinjaGenerator::WriteBuild(this_02,(ostream *)pcVar16,&phonyBuild,0,(bool *)0x0);
LAB_0030f2d4:
    cmNinjaTargetGenerator::AdditionalCleanFiles(&this->super_cmNinjaTargetGenerator,config);
    TVar8 = cmGeneratorTarget::GetType(this_00);
    if (TVar8 == GLOBAL_TARGET) goto LAB_0030f31e;
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
              ((string *)&cmdLists,&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddTargetAlias(this_02,(string *)&cmdLists,this_00,config);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&desc,"utility",(allocator<char> *)&ccConfig);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)&cmdLists,this_01,&commands,config,fileConfig,&desc,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
    std::__cxx11::string::~string((string *)&desc);
    desc._M_dataplus._M_p = (pointer)&desc.field_2;
    desc._M_string_length = 0;
    desc.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ccConfig,"EchoString",(allocator<char> *)&local_598);
    cVar14 = cmGeneratorTarget::GetProperty(this_00,&ccConfig);
    std::__cxx11::string::~string((string *)&ccConfig);
    if (cVar14.Value == (string *)0x0) {
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_598,&this->super_cmNinjaTargetGenerator);
      std::operator+(&ccConfig,"Running utility command for ",&local_598);
      std::__cxx11::string::operator=((string *)&desc,(string *)&ccConfig);
      std::__cxx11::string::~string((string *)&ccConfig);
      std::__cxx11::string::~string((string *)&local_598);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&desc);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ccConfig,"$(CMAKE_SOURCE_DIR)",(allocator<char> *)&local_498);
    psVar9 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)this_01);
    this_03 = &(this_01->super_cmLocalCommonGenerator).super_cmLocalGenerator.
               super_cmOutputConverter;
    source._M_str = (psVar9->_M_dataplus)._M_p;
    source._M_len = psVar9->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_598,this_03,source,SHELL);
    cmsys::SystemTools::ReplaceString((string *)&cmdLists,&ccConfig,&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)&ccConfig);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ccConfig,"$(CMAKE_BINARY_DIR)",(allocator<char> *)&local_498);
    psVar9 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_01);
    source_00._M_str = (psVar9->_M_dataplus)._M_p;
    source_00._M_len = psVar9->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_598,this_03,source_00,SHELL);
    cmsys::SystemTools::ReplaceString((string *)&cmdLists,&ccConfig,&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)&ccConfig);
    cmsys::SystemTools::ReplaceString((string *)&cmdLists,"$(ARGS)","");
    (*(this_02->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x16]
    )(&ccConfig,this_02,&cmdLists);
    std::__cxx11::string::operator=((string *)&cmdLists,(string *)&ccConfig);
    std::__cxx11::string::~string((string *)&ccConfig);
    lVar18 = std::__cxx11::string::find((char)(string *)&cmdLists,0x24);
    if (lVar18 == -1) {
      ccConfig._M_dataplus._M_p = (pointer)&ccConfig.field_2;
      ccConfig._M_string_length = 0;
      ccConfig.field_2._M_local_buf[0] = '\0';
      bVar6 = cmTarget::IsPerConfig(this_00->Target);
      if (bVar6) {
        TVar8 = cmGeneratorTarget::GetType(this_00);
        if (TVar8 != GLOBAL_TARGET) {
          std::__cxx11::string::_M_assign((string *)&ccConfig);
        }
      }
      _Var7 = std::operator==(config,fileConfig);
      if (_Var7) {
LAB_0030f09f:
        cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                  (&local_498,&this->super_cmNinjaTargetGenerator);
        std::operator+(&local_598,"Utility command for ",&local_498);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"",&local_5d9);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"",&local_5da);
        local_2e8.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             util_outputs.WorkDirOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2e8.GG = util_outputs.GG;
        local_2e8.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             util_outputs.ExplicitOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2e8.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             util_outputs.ExplicitOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_2e8.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             util_outputs.ExplicitOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        util_outputs.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        util_outputs.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        util_outputs.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2e8.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             util_outputs.WorkDirOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2e8.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             util_outputs.WorkDirOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        util_outputs.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        util_outputs.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        util_outputs.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_418.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             deps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_418.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             deps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_418.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             deps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmGlobalNinjaGenerator::WriteCustomCommandBuild
                  (this_02,(string *)&cmdLists,&desc,&local_598,&local_3b8,&local_3d8,local_540,true
                   ,&ccConfig,&local_2e8,&local_418,&local_438);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_438);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_418);
        cmGlobalNinjaGenerator::CCOutputs::~CCOutputs(&local_2e8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_598);
        std::__cxx11::string::~string((string *)&local_498);
      }
      else {
        psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        sVar15 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&this_02->PerConfigUtilityTargets,psVar9);
        if (sVar15 != 0) goto LAB_0030f09f;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&phonyBuild.ExplicitDeps,&utilCommandName);
      TVar8 = cmGeneratorTarget::GetType(this_00);
      if (TVar8 == GLOBAL_TARGET) {
        pcVar16 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
      }
      else {
        pcVar16 = cmNinjaTargetGenerator::GetImplFileStream
                            (&this->super_cmNinjaTargetGenerator,fileConfig);
      }
      cmGlobalNinjaGenerator::WriteBuild(this_02,(ostream *)pcVar16,&phonyBuild,0,(bool *)0x0);
      std::__cxx11::string::~string((string *)&ccConfig);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&cmdLists);
      goto LAB_0030f2d4;
    }
    std::__cxx11::string::~string((string *)&desc);
  }
  std::__cxx11::string::~string((string *)&cmdLists);
LAB_0030f31e:
  std::__cxx11::string::~string((string *)&outputConfig);
  cmGlobalNinjaGenerator::CCOutputs::~CCOutputs(&util_outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&deps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  cmNinjaBuild::~cmNinjaBuild(&phonyBuild);
  std::__cxx11::string::~string((string *)&utilCommandName);
  std::__cxx11::string::~string((string *)&configDir);
  return;
}

Assistant:

void cmNinjaUtilityTargetGenerator::WriteUtilBuildStatements(
  std::string const& config, std::string const& fileConfig)
{
  cmGlobalNinjaGenerator* gg = this->GetGlobalGenerator();
  cmLocalNinjaGenerator* lg = this->GetLocalGenerator();
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();

  std::string configDir;
  if (genTarget->Target->IsPerConfig()) {
    configDir = gg->ConfigDirectory(fileConfig);
  }
  std::string utilCommandName =
    cmStrCat(lg->GetCurrentBinaryDirectory(), "/CMakeFiles", configDir, "/",
             this->GetTargetName(), ".util");
  utilCommandName = this->ConvertToNinjaPath(utilCommandName);

  cmNinjaBuild phonyBuild("phony");
  std::vector<std::string> commands;
  cmNinjaDeps deps;
  cmGlobalNinjaGenerator::CCOutputs util_outputs(gg);
  util_outputs.ExplicitOuts.emplace_back(utilCommandName);

  bool uses_terminal = false;
  {
    std::array<std::vector<cmCustomCommand> const*, 2> const cmdLists = {
      { &genTarget->GetPreBuildCommands(), &genTarget->GetPostBuildCommands() }
    };

    for (std::vector<cmCustomCommand> const* cmdList : cmdLists) {
      for (cmCustomCommand const& ci : *cmdList) {
        cmCustomCommandGenerator ccg(ci, fileConfig, lg);
        lg->AppendCustomCommandDeps(ccg, deps, fileConfig);
        lg->AppendCustomCommandLines(ccg, commands);
        util_outputs.Add(ccg.GetByproducts());
        if (ci.GetUsesTerminal()) {
          uses_terminal = true;
        }
      }
    }
  }

  {
    std::vector<cmSourceFile*> sources;
    genTarget->GetSourceFiles(sources, config);
    for (cmSourceFile const* source : sources) {
      if (cmCustomCommand const* cc = source->GetCustomCommand()) {
        cmCustomCommandGenerator ccg(*cc, config, lg);
        lg->AddCustomCommandTarget(cc, genTarget);

        // Depend on all custom command outputs.
        const std::vector<std::string>& ccOutputs = ccg.GetOutputs();
        const std::vector<std::string>& ccByproducts = ccg.GetByproducts();
        std::transform(ccOutputs.begin(), ccOutputs.end(),
                       std::back_inserter(deps), this->MapToNinjaPath());
        std::transform(ccByproducts.begin(), ccByproducts.end(),
                       std::back_inserter(deps), this->MapToNinjaPath());
      }
    }
  }

  std::string outputConfig;
  if (genTarget->Target->IsPerConfig()) {
    outputConfig = config;
  }
  lg->AppendTargetOutputs(genTarget, phonyBuild.Outputs, outputConfig);
  if (genTarget->Target->GetType() != cmStateEnums::GLOBAL_TARGET) {
    lg->AppendTargetOutputs(genTarget, gg->GetByproductsForCleanTarget(),
                            config);
    std::copy(util_outputs.ExplicitOuts.begin(),
              util_outputs.ExplicitOuts.end(),
              std::back_inserter(gg->GetByproductsForCleanTarget()));
  }
  lg->AppendTargetDepends(genTarget, deps, config, fileConfig,
                          DependOnTargetArtifact);

  if (commands.empty()) {
    phonyBuild.Comment = "Utility command for " + this->GetTargetName();
    phonyBuild.ExplicitDeps = std::move(deps);
    if (genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
      gg->WriteBuild(this->GetImplFileStream(fileConfig), phonyBuild);
    } else {
      gg->WriteBuild(this->GetCommonFileStream(), phonyBuild);
    }
  } else {
    std::string command = lg->BuildCommandLine(
      commands, config, fileConfig, "utility", this->GeneratorTarget);
    std::string desc;
    cmValue echoStr = genTarget->GetProperty("EchoString");
    if (echoStr) {
      desc = *echoStr;
    } else {
      desc = "Running utility command for " + this->GetTargetName();
    }

    // TODO: fix problematic global targets.  For now, search and replace the
    // makefile vars.
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_SOURCE_DIR)",
      lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                cmOutputConverter::SHELL));
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_BINARY_DIR)",
      lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                cmOutputConverter::SHELL));
    cmSystemTools::ReplaceString(command, "$(ARGS)", "");
    command = gg->ExpandCFGIntDir(command, config);

    if (command.find('$') != std::string::npos) {
      return;
    }

    std::string ccConfig;
    if (genTarget->Target->IsPerConfig() &&
        genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
      ccConfig = config;
    }
    if (config == fileConfig ||
        gg->GetPerConfigUtilityTargets().count(genTarget->GetName())) {
      gg->WriteCustomCommandBuild(
        command, desc, "Utility command for " + this->GetTargetName(),
        /*depfile*/ "", /*job_pool*/ "", uses_terminal,
        /*restat*/ true, ccConfig, std::move(util_outputs), std::move(deps));
    }

    phonyBuild.ExplicitDeps.push_back(utilCommandName);
    if (genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
      gg->WriteBuild(this->GetImplFileStream(fileConfig), phonyBuild);
    } else {
      gg->WriteBuild(this->GetCommonFileStream(), phonyBuild);
    }
  }

  // Find ADDITIONAL_CLEAN_FILES
  this->AdditionalCleanFiles(config);

  // Add an alias for the logical target name regardless of what directory
  // contains it.  Skip this for GLOBAL_TARGET because they are meant to
  // be per-directory and have one at the top-level anyway.
  if (genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
    gg->AddTargetAlias(this->GetTargetName(), genTarget, config);
  }
}